

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_as_json_x1000(void)

{
  char cVar1;
  undefined8 uVar2;
  time_t tVar3;
  ulong uVar4;
  undefined8 uVar5;
  long *plVar6;
  long *__s1;
  int iVar7;
  undefined8 unaff_R14;
  long *unaff_R15;
  size_t len;
  bson_oid_t oid;
  bson_decimal128_t decimal128;
  undefined1 auStack_108 [8];
  undefined8 uStack_100;
  long *plStack_f8;
  code *pcStack_f0;
  long lStack_e0;
  undefined8 uStack_d8;
  long *plStack_d0;
  code *pcStack_c8;
  long lStack_b8;
  undefined8 uStack_b0;
  long *plStack_a8;
  code *pcStack_a0;
  long lStack_90;
  undefined8 uStack_88;
  long *plStack_80;
  long alStack_70 [3];
  undefined8 uStack_58;
  code *pcStack_50;
  undefined4 local_48;
  undefined1 local_44;
  undefined1 local_3c [12];
  undefined8 local_30;
  undefined8 local_28;
  
  local_28 = 0x3040000000000000;
  local_30 = 0xb;
  pcStack_50 = (code *)0x12c501;
  bson_oid_init_from_string(local_3c,"123412341234abcdabcdabcd");
  pcStack_50 = (code *)0x12c506;
  uVar2 = bson_new();
  pcStack_50 = (code *)0x12c52a;
  cVar1 = bson_append_utf8(uVar2,"utf8",0xffffffff,"bar",0xffffffff);
  if (cVar1 == '\0') {
    pcStack_50 = (code *)0x12c82e;
    test_bson_as_json_x1000_cold_1();
LAB_0012c82e:
    pcStack_50 = (code *)0x12c833;
    test_bson_as_json_x1000_cold_2();
LAB_0012c833:
    pcStack_50 = (code *)0x12c838;
    test_bson_as_json_x1000_cold_3();
LAB_0012c838:
    pcStack_50 = (code *)0x12c83d;
    test_bson_as_json_x1000_cold_4();
LAB_0012c83d:
    pcStack_50 = (code *)0x12c842;
    test_bson_as_json_x1000_cold_5();
LAB_0012c842:
    pcStack_50 = (code *)0x12c847;
    test_bson_as_json_x1000_cold_6();
LAB_0012c847:
    pcStack_50 = (code *)0x12c84c;
    test_bson_as_json_x1000_cold_7();
LAB_0012c84c:
    pcStack_50 = (code *)0x12c851;
    test_bson_as_json_x1000_cold_8();
LAB_0012c851:
    pcStack_50 = (code *)0x12c856;
    test_bson_as_json_x1000_cold_9();
LAB_0012c856:
    pcStack_50 = (code *)0x12c85b;
    test_bson_as_json_x1000_cold_10();
LAB_0012c85b:
    pcStack_50 = (code *)0x12c860;
    test_bson_as_json_x1000_cold_11();
LAB_0012c860:
    pcStack_50 = (code *)0x12c865;
    test_bson_as_json_x1000_cold_12();
LAB_0012c865:
    pcStack_50 = (code *)0x12c86a;
    test_bson_as_json_x1000_cold_13();
LAB_0012c86a:
    pcStack_50 = (code *)0x12c86f;
    test_bson_as_json_x1000_cold_14();
LAB_0012c86f:
    pcStack_50 = (code *)0x12c874;
    test_bson_as_json_x1000_cold_15();
LAB_0012c874:
    pcStack_50 = (code *)0x12c879;
    test_bson_as_json_x1000_cold_16();
LAB_0012c879:
    pcStack_50 = (code *)0x12c87e;
    test_bson_as_json_x1000_cold_17();
LAB_0012c87e:
    pcStack_50 = (code *)0x12c883;
    test_bson_as_json_x1000_cold_18();
LAB_0012c883:
    pcStack_50 = (code *)0x12c888;
    test_bson_as_json_x1000_cold_19();
LAB_0012c888:
    pcStack_50 = (code *)0x12c88d;
    test_bson_as_json_x1000_cold_20();
  }
  else {
    pcStack_50 = (code *)0x12c54b;
    cVar1 = bson_append_int32(uVar2,"int32",0xffffffff,0x4d2);
    if (cVar1 == '\0') goto LAB_0012c82e;
    pcStack_50 = (code *)0x12c56c;
    cVar1 = bson_append_int64(uVar2,"int64",0xffffffff,0x10e1);
    if (cVar1 == '\0') goto LAB_0012c833;
    pcStack_50 = (code *)0x12c590;
    cVar1 = bson_append_double(0x9999999a,uVar2,"double",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012c838;
    pcStack_50 = (code *)0x12c5ac;
    cVar1 = bson_append_undefined(uVar2,"undefined",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012c83d;
    pcStack_50 = (code *)0x12c5c8;
    cVar1 = bson_append_null(uVar2,"null",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012c842;
    pcStack_50 = (code *)0x12c5e9;
    cVar1 = bson_append_oid(uVar2,"oid",0xffffffff,local_3c);
    if (cVar1 == '\0') goto LAB_0012c847;
    pcStack_50 = (code *)0x12c60a;
    cVar1 = bson_append_bool(uVar2,"true",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_0012c84c;
    pcStack_50 = (code *)0x12c628;
    cVar1 = bson_append_bool(uVar2,"false",0xffffffff,0);
    if (cVar1 == '\0') goto LAB_0012c851;
    pcStack_50 = (code *)0x12c637;
    tVar3 = time((time_t *)0x0);
    pcStack_50 = (code *)0x12c64e;
    cVar1 = bson_append_time_t(uVar2,"date",0xffffffff,tVar3);
    if (cVar1 == '\0') goto LAB_0012c856;
    pcStack_50 = (code *)0x12c65d;
    uVar4 = time((time_t *)0x0);
    pcStack_50 = (code *)0x12c679;
    cVar1 = bson_append_timestamp(uVar2,"timestamp",0xffffffff,uVar4 & 0xffffffff,0x4d2);
    if (cVar1 == '\0') goto LAB_0012c85b;
    pcStack_50 = (code *)0x12c6a3;
    cVar1 = bson_append_regex(uVar2,"regex",0xffffffff,"^abcd","xi");
    if (cVar1 == '\0') goto LAB_0012c860;
    pcStack_50 = (code *)0x12c6cb;
    cVar1 = bson_append_dbpointer(uVar2,"dbpointer",0xffffffff,"mycollection",local_3c);
    if (cVar1 == '\0') goto LAB_0012c865;
    pcStack_50 = (code *)0x12c6e7;
    cVar1 = bson_append_minkey(uVar2,"minkey",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012c86a;
    pcStack_50 = (code *)0x12c703;
    cVar1 = bson_append_maxkey(uVar2,"maxkey",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012c86f;
    pcStack_50 = (code *)0x12c72c;
    cVar1 = bson_append_symbol(uVar2,"symbol",0xffffffff,"var a = {};",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012c874;
    pcStack_50 = (code *)0x12c74d;
    cVar1 = bson_append_decimal128(uVar2,"decimal128",0xffffffff,&local_30);
    if (cVar1 == '\0') goto LAB_0012c879;
    pcStack_50 = (code *)0x12c75a;
    unaff_R14 = bson_new();
    pcStack_50 = (code *)0x12c776;
    cVar1 = bson_append_int32(unaff_R14,"0",0xffffffff,0x3c);
    if (cVar1 == '\0') goto LAB_0012c87e;
    pcStack_50 = (code *)0x12c795;
    cVar1 = bson_append_document(uVar2,"document",0xffffffff,unaff_R14);
    if (cVar1 == '\0') goto LAB_0012c883;
    pcStack_50 = (code *)0x12c7b4;
    cVar1 = bson_append_array(uVar2,"array",0xffffffff,unaff_R14);
    if (cVar1 == '\0') goto LAB_0012c888;
    local_44 = 4;
    local_48 = 0x3020100;
    pcStack_50 = (code *)0x12c7e7;
    cVar1 = bson_append_binary(uVar2,"binary",0xffffffff,0,&local_48,5);
    if (cVar1 != '\0') {
      iVar7 = 1000;
      do {
        pcStack_50 = (code *)0x12c802;
        uVar5 = bson_as_json(uVar2,&local_48);
        pcStack_50 = (code *)0x12c80a;
        bson_free(uVar5);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      pcStack_50 = (code *)0x12c816;
      bson_destroy(uVar2);
      pcStack_50 = (code *)0x12c81e;
      bson_destroy(unaff_R14);
      return;
    }
  }
  pcStack_50 = test_bson_as_json_multi;
  test_bson_as_json_x1000_cold_21();
  plVar6 = alStack_70;
  __s1 = alStack_70;
  uStack_58 = uVar2;
  pcStack_50 = (code *)unaff_R14;
  uVar2 = bson_new();
  bson_oid_init_from_string(alStack_70,"57e193d7a9cc81b4027498b5");
  cVar1 = bson_append_oid(uVar2,"_id",0xffffffff,alStack_70);
  if (cVar1 == '\0') {
    test_bson_as_json_multi_cold_1();
LAB_0012ce45:
    test_bson_as_json_multi_cold_2();
LAB_0012ce4a:
    test_bson_as_json_multi_cold_3();
LAB_0012ce4f:
    test_bson_as_json_multi_cold_4();
LAB_0012ce54:
    test_bson_as_json_multi_cold_5();
LAB_0012ce59:
    test_bson_as_json_multi_cold_6();
LAB_0012ce5e:
    test_bson_as_json_multi_cold_7();
LAB_0012ce63:
    test_bson_as_json_multi_cold_8();
LAB_0012ce68:
    test_bson_as_json_multi_cold_9();
LAB_0012ce6d:
    test_bson_as_json_multi_cold_10();
LAB_0012ce72:
    test_bson_as_json_multi_cold_11();
LAB_0012ce77:
    test_bson_as_json_multi_cold_12();
LAB_0012ce7c:
    test_bson_as_json_multi_cold_13();
LAB_0012ce81:
    test_bson_as_json_multi_cold_14();
LAB_0012ce86:
    test_bson_as_json_multi_cold_15();
LAB_0012ce8b:
    test_bson_as_json_multi_cold_16();
LAB_0012ce90:
    test_bson_as_json_multi_cold_17();
LAB_0012ce95:
    test_bson_as_json_multi_cold_18();
LAB_0012ce9a:
    test_bson_as_json_multi_cold_19();
LAB_0012ce9f:
    test_bson_as_json_multi_cold_20();
LAB_0012cea4:
    test_bson_as_json_multi_cold_21();
LAB_0012cea9:
    test_bson_as_json_multi_cold_22();
LAB_0012ceae:
    test_bson_as_json_multi_cold_23();
LAB_0012ceb3:
    test_bson_as_json_multi_cold_24();
LAB_0012ceb8:
    __s1 = plVar6;
    test_bson_as_json_multi_cold_25();
LAB_0012cebd:
    test_bson_as_json_multi_cold_26();
LAB_0012cec2:
    test_bson_as_json_multi_cold_27();
LAB_0012cec7:
    test_bson_as_json_multi_cold_28();
LAB_0012cecc:
    test_bson_as_json_multi_cold_29();
LAB_0012ced1:
    test_bson_as_json_multi_cold_30();
LAB_0012ced6:
    test_bson_as_json_multi_cold_31();
LAB_0012cedb:
    test_bson_as_json_multi_cold_32();
LAB_0012cee0:
    test_bson_as_json_multi_cold_33();
LAB_0012cee5:
    test_bson_as_json_multi_cold_34();
LAB_0012ceea:
    test_bson_as_json_multi_cold_35();
  }
  else {
    cVar1 = bson_append_symbol(uVar2,"Symbol",0xffffffff,"symbol",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ce45;
    cVar1 = bson_append_utf8(uVar2,"String",0xffffffff,"string",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ce4a;
    cVar1 = bson_append_int32(uVar2,"Int32",0xffffffff,0x2a);
    if (cVar1 == '\0') goto LAB_0012ce4f;
    cVar1 = bson_append_int64(uVar2,"Int64",0xffffffff,0x2a);
    if (cVar1 == '\0') goto LAB_0012ce54;
    cVar1 = bson_append_double(0,uVar2,"Double",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ce59;
    alStack_70[0] = -0x3712543c08c7b35d;
    alStack_70[1] = 0xb68dab92a91478a3;
    cVar1 = bson_append_binary(uVar2,"Binary",0xffffffff,3,alStack_70,0x10);
    if (cVar1 == '\0') goto LAB_0012ce5e;
    alStack_70[0] = CONCAT35(alStack_70[0]._5_3_,0x500000000);
    alStack_70[0] = CONCAT44(alStack_70[0]._4_4_,0x4030201);
    cVar1 = bson_append_binary(uVar2,"BinaryUserDefined",0xffffffff,0x80,alStack_70,5);
    if (cVar1 == '\0') goto LAB_0012ce63;
    cVar1 = bson_append_code(uVar2,"Code",0xffffffff,"function() {}");
    if (cVar1 == '\0') goto LAB_0012ce68;
    plVar6 = (long *)bson_new();
    cVar1 = bson_append_code_with_scope(uVar2,"CodeWithScope",0xffffffff,"function() {}",plVar6);
    if (cVar1 == '\0') goto LAB_0012ce6d;
    bson_destroy(plVar6);
    plVar6 = (long *)bson_new();
    cVar1 = bson_append_utf8(plVar6,"foo",0xffffffff,"bar",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ce72;
    cVar1 = bson_append_document(uVar2,"Subdocument",0xffffffff,plVar6);
    if (cVar1 == '\0') goto LAB_0012ce77;
    bson_destroy(plVar6);
    plVar6 = (long *)bson_new();
    cVar1 = bson_append_int32(plVar6,"0",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_0012ce7c;
    cVar1 = bson_append_int32(plVar6,"1",0xffffffff,2);
    if (cVar1 == '\0') goto LAB_0012ce81;
    cVar1 = bson_append_int32(plVar6,"2",0xffffffff,3);
    if (cVar1 == '\0') goto LAB_0012ce86;
    cVar1 = bson_append_int32(plVar6,"3",0xffffffff,4);
    if (cVar1 == '\0') goto LAB_0012ce8b;
    cVar1 = bson_append_int32(plVar6,"4",0xffffffff,5);
    if (cVar1 == '\0') goto LAB_0012ce90;
    cVar1 = bson_append_array(uVar2,"Array",0xffffffff,plVar6);
    if (cVar1 == '\0') goto LAB_0012ce95;
    bson_destroy(plVar6);
    cVar1 = bson_append_timestamp(uVar2,"Timestamp",0xffffffff,0x2a,1);
    if (cVar1 == '\0') goto LAB_0012ce9a;
    cVar1 = bson_append_regex(uVar2,"Regex",0xffffffff,"pattern","");
    if (cVar1 == '\0') goto LAB_0012ce9f;
    cVar1 = bson_append_date_time(uVar2,"DatetimeEpoch",0xffffffff,0);
    if (cVar1 == '\0') goto LAB_0012cea4;
    cVar1 = bson_append_date_time(uVar2,"DatetimePositive",0xffffffff,0x7fffffff);
    if (cVar1 == '\0') goto LAB_0012cea9;
    cVar1 = bson_append_date_time(uVar2,"DatetimeNegative",0xffffffff,0xffffffff80000000);
    if (cVar1 == '\0') goto LAB_0012ceae;
    cVar1 = bson_append_bool(uVar2,"True",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_0012ceb3;
    cVar1 = bson_append_bool(uVar2,"False",0xffffffff,0);
    if (cVar1 == '\0') goto LAB_0012ceb8;
    bson_oid_init_from_string(alStack_70,"57e193d7a9cc81b4027498b1");
    cVar1 = bson_append_dbpointer(uVar2,"DBPointer",0xffffffff,"collection",alStack_70);
    if (cVar1 == '\0') goto LAB_0012cebd;
    __s1 = (long *)bson_new();
    bson_oid_init_from_string(alStack_70,"57fd71e96e32ab4225b723fb");
    cVar1 = bson_append_utf8(__s1,"$ref",0xffffffff,"collection",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012cec2;
    cVar1 = bson_append_oid(__s1,"$id",0xffffffff,alStack_70);
    if (cVar1 == '\0') goto LAB_0012cec7;
    cVar1 = bson_append_utf8(__s1,"$db",0xffffffff,"database",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012cecc;
    cVar1 = bson_append_document(uVar2,"DBRef",0xffffffff,__s1);
    if (cVar1 == '\0') goto LAB_0012ced1;
    bson_destroy(__s1);
    cVar1 = bson_append_minkey(uVar2,"Minkey",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ced6;
    cVar1 = bson_append_maxkey(uVar2,"Maxkey",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012cedb;
    cVar1 = bson_append_null(uVar2,"Null",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012cee0;
    cVar1 = bson_append_undefined(uVar2,"Undefined",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012cee5;
    alStack_70[1] = 0x3040000000000000;
    alStack_70[0] = 0xb;
    cVar1 = bson_append_decimal128(uVar2,"Decimal128",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ceea;
    __s1 = (long *)bson_as_json(uVar2,alStack_70);
    if (__s1 == (long *)
                "{ \"_id\" : { \"$oid\" : \"57e193d7a9cc81b4027498b5\" }, \"Symbol\" : \"symbol\", \"String\" : \"string\", \"Int32\" : 42, \"Int64\" : 42, \"Double\" : -1.0, \"Binary\" : { \"$binary\" : \"o0w498Or7cijeBSpkquNtg==\", \"$type\" : \"03\" }, \"BinaryUserDefined\" : { \"$binary\" : \"AQIDBAU=\", \"$type\" : \"80\" }, \"Code\" : { \"$code\" : \"function() {}\" }, \"CodeWithScope\" : { \"$code\" : \"function() {}\", \"$scope\" : { } }, \"Subdocument\" : { \"foo\" : \"bar\" }, \"Array\" : [ 1, 2, 3, 4, 5 ], \"Timestamp\" : { \"$timestamp\" : { \"t\" : 42, \"i\" : 1 } }, \"Regex\" : { \"$regex\" : \"pattern\", \"$options\" : \"\" }, \"DatetimeEpoch\" : { \"$date\" : 0 }, \"DatetimePositive\" : { \"$date\" : 2147483647 }, \"DatetimeNegative\" : { \"$date\" : -2147483648 }, \"True\" : true, \"False\" : false, \"DBPointer\" : { \"$ref\" : \"collection\", \"$id\" : \"57e193d7a9cc81b4027498b1\" }, \"DBRef\" : { \"$ref\" : \"collection\", \"$id\" : { \"$oid\" : \"57fd71e96e32ab4225b723fb\" }, \"$db\" : \"database\" }, \"Minkey\" : { \"$minKey\" : 1 }, \"Maxkey\" : { \"$maxKey\" : 1 }, \"Null\" : null, \"Undefined\" : { \"$undefined\" : true }, \"Decimal128\" : { \"$numberDecimal\" : \"11\" } }"
       ) {
LAB_0012ce28:
      bson_free(__s1);
      bson_destroy(uVar2);
      return;
    }
    iVar7 = strcmp((char *)__s1,
                   "{ \"_id\" : { \"$oid\" : \"57e193d7a9cc81b4027498b5\" }, \"Symbol\" : \"symbol\", \"String\" : \"string\", \"Int32\" : 42, \"Int64\" : 42, \"Double\" : -1.0, \"Binary\" : { \"$binary\" : \"o0w498Or7cijeBSpkquNtg==\", \"$type\" : \"03\" }, \"BinaryUserDefined\" : { \"$binary\" : \"AQIDBAU=\", \"$type\" : \"80\" }, \"Code\" : { \"$code\" : \"function() {}\" }, \"CodeWithScope\" : { \"$code\" : \"function() {}\", \"$scope\" : { } }, \"Subdocument\" : { \"foo\" : \"bar\" }, \"Array\" : [ 1, 2, 3, 4, 5 ], \"Timestamp\" : { \"$timestamp\" : { \"t\" : 42, \"i\" : 1 } }, \"Regex\" : { \"$regex\" : \"pattern\", \"$options\" : \"\" }, \"DatetimeEpoch\" : { \"$date\" : 0 }, \"DatetimePositive\" : { \"$date\" : 2147483647 }, \"DatetimeNegative\" : { \"$date\" : -2147483648 }, \"True\" : true, \"False\" : false, \"DBPointer\" : { \"$ref\" : \"collection\", \"$id\" : \"57e193d7a9cc81b4027498b1\" }, \"DBRef\" : { \"$ref\" : \"collection\", \"$id\" : { \"$oid\" : \"57fd71e96e32ab4225b723fb\" }, \"$db\" : \"database\" }, \"Minkey\" : { \"$minKey\" : 1 }, \"Maxkey\" : { \"$maxKey\" : 1 }, \"Null\" : null, \"Undefined\" : { \"$undefined\" : true }, \"Decimal128\" : { \"$numberDecimal\" : \"11\" } }"
                  );
    if (iVar7 == 0) goto LAB_0012ce28;
  }
  test_bson_as_json_multi_cold_36();
  pcStack_a0 = (code *)0x12cf05;
  uStack_88 = uVar2;
  plStack_80 = __s1;
  uVar2 = bson_new();
  pcStack_a0 = (code *)0x12cf29;
  cVar1 = bson_append_utf8(uVar2,"foo",0xffffffff,"bar",0xffffffff);
  if (cVar1 == '\0') {
    pcStack_a0 = (code *)0x12cf78;
    test_bson_as_json_string_cold_1();
LAB_0012cf78:
    pcStack_a0 = (code *)0x12cf7d;
    test_bson_as_json_string_cold_2();
  }
  else {
    unaff_R15 = &lStack_90;
    pcStack_a0 = (code *)0x12cf3d;
    plVar6 = (long *)bson_as_json(uVar2,unaff_R15);
    if (lStack_90 != 0x11) goto LAB_0012cf78;
    pcStack_a0 = (code *)0x12cf55;
    iVar7 = strcmp("{ \"foo\" : \"bar\" }",(char *)plVar6);
    __s1 = plVar6;
    if (iVar7 == 0) {
      pcStack_a0 = (code *)0x12cf61;
      bson_free(plVar6);
      pcStack_a0 = (code *)0x12cf69;
      bson_destroy(uVar2);
      return;
    }
  }
  pcStack_a0 = test_bson_as_json_int32;
  test_bson_as_json_string_cold_3();
  pcStack_c8 = (code *)0x12cf90;
  uStack_b0 = uVar2;
  plStack_a8 = __s1;
  pcStack_a0 = (code *)unaff_R15;
  uVar2 = bson_new();
  pcStack_c8 = (code *)0x12cfac;
  cVar1 = bson_append_int32(uVar2,"foo",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_c8 = (code *)0x12cffb;
    test_bson_as_json_int32_cold_1();
LAB_0012cffb:
    pcStack_c8 = (code *)0x12d000;
    test_bson_as_json_int32_cold_2();
  }
  else {
    unaff_R15 = &lStack_b8;
    pcStack_c8 = (code *)0x12cfc0;
    plVar6 = (long *)bson_as_json(uVar2,unaff_R15);
    if (lStack_b8 != 0x10) goto LAB_0012cffb;
    pcStack_c8 = (code *)0x12cfd8;
    iVar7 = strcmp("{ \"foo\" : 1234 }",(char *)plVar6);
    __s1 = plVar6;
    if (iVar7 == 0) {
      pcStack_c8 = (code *)0x12cfe4;
      bson_free(plVar6);
      pcStack_c8 = (code *)0x12cfec;
      bson_destroy(uVar2);
      return;
    }
  }
  pcStack_c8 = test_bson_as_json_int64;
  test_bson_as_json_int32_cold_3();
  pcStack_f0 = (code *)0x12d013;
  uStack_d8 = uVar2;
  plStack_d0 = __s1;
  pcStack_c8 = (code *)unaff_R15;
  uVar2 = bson_new();
  pcStack_f0 = (code *)0x12d034;
  cVar1 = bson_append_int64(uVar2,"foo",0xffffffff,0x4bc4ea0973c01f2);
  if (cVar1 == '\0') {
    pcStack_f0 = (code *)0x12d083;
    test_bson_as_json_int64_cold_1();
LAB_0012d083:
    pcStack_f0 = (code *)0x12d088;
    test_bson_as_json_int64_cold_2();
  }
  else {
    unaff_R15 = &lStack_e0;
    pcStack_f0 = (code *)0x12d048;
    plVar6 = (long *)bson_as_json(uVar2,unaff_R15);
    if (lStack_e0 != 0x1e) goto LAB_0012d083;
    pcStack_f0 = (code *)0x12d060;
    iVar7 = strcmp("{ \"foo\" : 341234123412341234 }",(char *)plVar6);
    __s1 = plVar6;
    if (iVar7 == 0) {
      pcStack_f0 = (code *)0x12d06c;
      bson_free(plVar6);
      pcStack_f0 = (code *)0x12d074;
      bson_destroy(uVar2);
      return;
    }
  }
  pcStack_f0 = test_bson_as_json_double;
  test_bson_as_json_int64_cold_3();
  uStack_100 = uVar2;
  plStack_f8 = __s1;
  pcStack_f0 = (code *)unaff_R15;
  uVar2 = bson_new();
  cVar1 = bson_append_double(0,uVar2,"foo",0xffffffff);
  if (cVar1 == '\0') {
    test_bson_as_json_double_cold_1();
LAB_0012d1b2:
    test_bson_as_json_double_cold_2();
LAB_0012d1b7:
    test_bson_as_json_double_cold_3();
LAB_0012d1bc:
    test_bson_as_json_double_cold_4();
  }
  else {
    cVar1 = bson_append_double(0,uVar2,"bar",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d1b2;
    cVar1 = bson_append_double(0,uVar2,"baz",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d1b7;
    cVar1 = bson_append_double(0,uVar2,"quux",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d1bc;
    cVar1 = bson_append_double(0xa2879f2e,uVar2,"huge",0xffffffff);
    if (cVar1 != '\0') {
      __s1 = (long *)bson_as_json(uVar2,auStack_108);
      unaff_R15 = (long *)bson_strdup_printf(0xa2879f2e,
                                             "{ \"foo\" : 123.5, \"bar\" : 3.0, \"baz\" : -1.0, \"quux\" : 0.03125, \"huge\" : %.20g }"
                                            );
      if (__s1 == unaff_R15) {
LAB_0012d18b:
        bson_free(unaff_R15);
        bson_free(__s1);
        bson_destroy(uVar2);
        return;
      }
      iVar7 = strcmp((char *)__s1,(char *)unaff_R15);
      if (iVar7 == 0) goto LAB_0012d18b;
      goto LAB_0012d1c6;
    }
  }
  test_bson_as_json_double_cold_5();
LAB_0012d1c6:
  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",__s1,unaff_R15);
  abort();
}

Assistant:

static void
test_bson_as_json_x1000 (void)
{
   bson_oid_t oid;
   bson_decimal128_t decimal128;
   bson_t *b;
   bson_t *b2;
   char *str;
   size_t len;
   int i;

   decimal128.high = 0x3040000000000000ULL;
   decimal128.low = 0x000000000000000B;
   bson_oid_init_from_string (&oid, "123412341234abcdabcdabcd");

   b = bson_new ();
   BSON_ASSERT (bson_append_utf8 (b, "utf8", -1, "bar", -1));
   BSON_ASSERT (bson_append_int32 (b, "int32", -1, 1234));
   BSON_ASSERT (bson_append_int64 (b, "int64", -1, 4321));
   BSON_ASSERT (bson_append_double (b, "double", -1, 123.4));
   BSON_ASSERT (bson_append_undefined (b, "undefined", -1));
   BSON_ASSERT (bson_append_null (b, "null", -1));
   BSON_ASSERT (bson_append_oid (b, "oid", -1, &oid));
   BSON_ASSERT (bson_append_bool (b, "true", -1, true));
   BSON_ASSERT (bson_append_bool (b, "false", -1, false));
   BSON_ASSERT (bson_append_time_t (b, "date", -1, time (NULL)));
   BSON_ASSERT (
      bson_append_timestamp (b, "timestamp", -1, (uint32_t) time (NULL), 1234));
   BSON_ASSERT (bson_append_regex (b, "regex", -1, "^abcd", "xi"));
   BSON_ASSERT (
      bson_append_dbpointer (b, "dbpointer", -1, "mycollection", &oid));
   BSON_ASSERT (bson_append_minkey (b, "minkey", -1));
   BSON_ASSERT (bson_append_maxkey (b, "maxkey", -1));
   BSON_ASSERT (bson_append_symbol (b, "symbol", -1, "var a = {};", -1));
   BSON_ASSERT (bson_append_decimal128 (b, "decimal128", -1, &decimal128));

   b2 = bson_new ();
   BSON_ASSERT (bson_append_int32 (b2, "0", -1, 60));
   BSON_ASSERT (bson_append_document (b, "document", -1, b2));
   BSON_ASSERT (bson_append_array (b, "array", -1, b2));

   {
      const uint8_t binary[] = {0, 1, 2, 3, 4};
      BSON_ASSERT (bson_append_binary (
         b, "binary", -1, BSON_SUBTYPE_BINARY, binary, sizeof binary));
   }

   for (i = 0; i < 1000; i++) {
      str = bson_as_json (b, &len);
      bson_free (str);
   }

   bson_destroy (b);
   bson_destroy (b2);
}